

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

ssize_t httplib::detail::write_headers(Stream *strm,Headers *headers)

{
  int iVar1;
  int extraout_var;
  int extraout_var_00;
  long lVar2;
  __node_base *p_Var3;
  string s;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  p_Var3 = &(headers->_M_h)._M_before_begin;
  lVar2 = 0;
  do {
    p_Var3 = p_Var3->_M_nxt;
    if (p_Var3 == (__node_base *)0x0) {
      iVar1 = (*strm->_vptr_Stream[6])(strm,"\r\n",2);
      if (extraout_var_00 < 0) {
        lVar2 = 0;
      }
      return lVar2 + CONCAT44(extraout_var_00,iVar1);
    }
    local_48 = 0;
    local_40 = 0;
    local_50 = &local_40;
    ::std::__cxx11::string::_M_assign((string *)&local_50);
    ::std::__cxx11::string::append((char *)&local_50);
    ::std::__cxx11::string::_M_append((char *)&local_50,(ulong)p_Var3[5]._M_nxt);
    ::std::__cxx11::string::append((char *)&local_50);
    iVar1 = (*strm->_vptr_Stream[6])(strm,local_50,local_48);
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar2 = lVar2 + CONCAT44(extraout_var,iVar1);
  } while (-1 < extraout_var);
  return CONCAT44(extraout_var,iVar1);
}

Assistant:

inline ssize_t write_headers(Stream &strm, const Headers &headers) {
  ssize_t write_len = 0;
  for (const auto &x : headers) {
    std::string s;
    s = x.first;
    s += ": ";
    s += x.second;
    s += "\r\n";

    auto len = strm.write(s.data(), s.size());
    if (len < 0) { return len; }
    write_len += len;
  }
  auto len = strm.write("\r\n");
  if (len < 0) { return len; }
  write_len += len;
  return write_len;
}